

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

FieldSubset * __thiscall
capnp::StructSchema::getNonUnionFields(FieldSubset *__return_storage_ptr__,StructSchema *this)

{
  RawBrandedSchema *pRVar1;
  uint16_t *puVar2;
  byte *pbVar3;
  StructDataBitCount SVar4;
  ushort uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Reader fields;
  ListReader local_88;
  PointerReader local_58;
  
  local_58.pointer = (WirePointer *)((this->super_Schema).raw)->generic->encodedNode;
  local_58.segment = (SegmentReader *)0x0;
  local_58.capTable = (CapTableReader *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  uVar5 = 0;
  _::PointerReader::getStruct((StructReader *)&local_88,&local_58,(word *)0x0);
  SVar4 = local_88.structDataSize;
  pbVar3 = local_88.ptr;
  local_58.pointer = (WirePointer *)(CONCAT44(local_88.step,local_88.elementCount) + 0x18);
  uVar6 = local_88.segment._0_4_;
  uVar7 = local_88.segment._4_4_;
  uVar8 = local_88.capTable._0_4_;
  uVar9 = local_88.capTable._4_4_;
  local_58.nestingLimit = local_88.nestingLimit;
  if (local_88.structPointerCount < 4) {
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    local_58.nestingLimit = 0x7fffffff;
    local_58.pointer = (WirePointer *)0x0;
  }
  local_58.segment = (SegmentReader *)CONCAT44(uVar7,uVar6);
  local_58.capTable = (CapTableReader *)CONCAT44(uVar9,uVar8);
  _::PointerReader::getList(&local_88,&local_58,INLINE_COMPOSITE,(word *)0x0);
  if (0xff < SVar4) {
    uVar5 = *(ushort *)(pbVar3 + 0x1e);
  }
  pRVar1 = (this->super_Schema).raw;
  (__return_storage_ptr__->list).reader.structDataSize = local_88.structDataSize;
  (__return_storage_ptr__->list).reader.structPointerCount = local_88.structPointerCount;
  (__return_storage_ptr__->list).reader.elementSize = local_88.elementSize;
  (__return_storage_ptr__->list).reader.field_0x27 = local_88._39_1_;
  *(ulong *)&(__return_storage_ptr__->list).reader.nestingLimit =
       CONCAT44(local_88._44_4_,local_88.nestingLimit);
  (__return_storage_ptr__->list).reader.ptr = local_88.ptr;
  (__return_storage_ptr__->list).reader.elementCount = local_88.elementCount;
  (__return_storage_ptr__->list).reader.step = local_88.step;
  (__return_storage_ptr__->list).reader.segment =
       (SegmentReader *)CONCAT44(local_88.segment._4_4_,local_88.segment._0_4_);
  (__return_storage_ptr__->list).reader.capTable =
       (CapTableReader *)CONCAT44(local_88.capTable._4_4_,local_88.capTable._0_4_);
  puVar2 = pRVar1->generic->membersByDiscriminant;
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  __return_storage_ptr__->indices = (uint16_t *)((ulong)((uint)uVar5 + (uint)uVar5) + (long)puVar2);
  __return_storage_ptr__->size_ = local_88.elementCount - uVar5;
  return __return_storage_ptr__;
}

Assistant:

StructSchema::FieldSubset StructSchema::getNonUnionFields() const {
  auto proto = getProto().getStruct();
  auto fields = proto.getFields();
  auto offset = proto.getDiscriminantCount();
  auto size = fields.size() - offset;
  return FieldSubset(*this, fields, raw->generic->membersByDiscriminant + offset, size);
}